

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

Config * jaegertracing::reporters::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  int queueSize_00;
  char (*in_R8) [1];
  duration local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> endpoint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> localAgentHostPort;
  int local_98;
  int iStack_94;
  bool logSpans;
  duration<long,_std::ratio<1L,_1L>_> local_90;
  seconds bufferFlushInterval;
  allocator local_79;
  int queueSize;
  allocator local_41;
  string local_40;
  duration local_20;
  Node *local_18;
  Node *configYAML_local;
  
  local_18 = configYAML;
  configYAML_local = (Node *)__return_storage_ptr__;
  bVar1 = YAML::Node::IsDefined(configYAML);
  if ((bVar1) && (bVar1 = YAML::Node::IsMap(local_18), bVar1)) {
    bufferFlushInterval.__r._4_4_ = 0;
    queueSize_00 = utils::yaml::findOrDefault<int,char[10],int>
                             (local_18,(char (*) [10])"queueSize",
                              (int *)((long)&bufferFlushInterval.__r + 4));
    local_98 = 0;
    iStack_94 = utils::yaml::findOrDefault<int,char[20],int>
                          (local_18,(char (*) [20])"bufferFlushInterval",&local_98);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_90,&stack0xffffffffffffff6c);
    localAgentHostPort.field_2._M_local_buf[0xe] = '\0';
    localAgentHostPort.field_2._M_local_buf[0xf] =
         utils::yaml::findOrDefault<bool,char[9],bool>
                   (local_18,(char (*) [9])"logSpans",
                    (bool *)(localAgentHostPort.field_2._M_local_buf + 0xe));
    utils::yaml::findOrDefault<std::__cxx11::string,char[19],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&endpoint.field_2 + 8),(yaml *)local_18,(Node *)"localAgentHostPort",
               (char (*) [19])0x34afcb,in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[9],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
               (yaml *)local_18,(Node *)"endpoint",(char (*) [9])0x34afcb,in_R8);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_e8,&local_90);
    Config(__return_storage_ptr__,queueSize_00,&local_e8,
           (bool)(localAgentHostPort.field_2._M_local_buf[0xf] & 1),
           (string *)((long)&endpoint.field_2 + 8),(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)(endpoint.field_2._M_local_buf + 8));
  }
  else {
    local_20 = defaultBufferFlushInterval();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"127.0.0.1:6831",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&queueSize,"",&local_79);
    Config(__return_storage_ptr__,100,&local_20,false,&local_40,(string *)&queueSize);
    std::__cxx11::string::~string((string *)&queueSize);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto queueSize =
            utils::yaml::findOrDefault<int>(configYAML, "queueSize", 0);
        const auto bufferFlushInterval =
            std::chrono::seconds(utils::yaml::findOrDefault<int>(
                configYAML, "bufferFlushInterval", 0));
        const auto logSpans =
            utils::yaml::findOrDefault<bool>(configYAML, "logSpans", false);
        const auto localAgentHostPort = utils::yaml::findOrDefault<std::string>(
            configYAML, "localAgentHostPort", "");
        const auto endpoint = utils::yaml::findOrDefault<std::string>(
            configYAML, "endpoint", "");
        return Config(
            queueSize, bufferFlushInterval, logSpans, localAgentHostPort, endpoint);
    }